

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_AddTxOut_RemoveTxOut_Test::TestBody(Transaction_AddTxOut_RemoveTxOut_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  Amount extraout_DL;
  Amount extraout_DL_00;
  undefined1 extraout_DL_01;
  char *pcVar3;
  AssertHelper local_260 [2];
  AssertHelper local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_list;
  AssertionResult gtest_ar_7;
  AssertHelper local_1d8;
  undefined1 local_1d0;
  TxOutReference txout_ref;
  Amount local_1c0 [72];
  Transaction tx;
  Script script;
  long local_100;
  AbstractTxOutReference local_f8;
  AbstractTxOutReference local_a8;
  AbstractTxOutReference local_58;
  
  cfd::core::Transaction::Transaction(&tx,2,0);
  std::__cxx11::string::string
            ((string *)&txout_ref,"76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac",
             (allocator *)&gtest_ar_7);
  cfd::core::Script::Script(&script,(string *)&txout_ref);
  std::__cxx11::string::~string((string *)&txout_ref);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _txout_ref = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_1c0[0] = extraout_DL;
      cfd::core::Transaction::AddTxOut((Amount *)&tx,(Script *)&txout_ref);
    }
  }
  else {
    testing::Message::Message((Message *)&txout_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17d,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  gtest_ar_7._0_4_ = cfd::core::Transaction::GetTxOutCount();
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&txout_ref,"tx.GetTxOutCount()","1",(uint *)&gtest_ar_7,(int *)&index_list)
  ;
  if (txout_ref == (TxOutReference)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index_list,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index_list,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_list);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)&local_58);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&local_58);
    }
  }
  else {
    testing::Message::Message((Message *)&txout_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17f,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffff00000000;
  uVar2 = cfd::core::Transaction::GetTxOutIndex((Script *)&tx);
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&txout_ref,"0","tx.GetTxOutIndex(script)",(int *)&gtest_ar_7,
             (uint *)&index_list);
  if (txout_ref == (TxOutReference)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index_list,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index_list,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_list);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _txout_ref = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_1c0[0] = extraout_DL_00;
      cfd::core::Transaction::AddTxOut((Amount *)&tx,(Script *)&txout_ref);
    }
  }
  else {
    testing::Message::Message((Message *)&txout_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x182,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  gtest_ar_7._0_4_ = uVar2;
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&txout_ref,"tx.GetTxOutCount()","2",(uint *)&gtest_ar_7,(int *)&index_list)
  ;
  if (txout_ref == (TxOutReference)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index_list,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index_list,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_list);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)&local_a8);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&local_a8);
    }
  }
  else {
    testing::Message::Message((Message *)&txout_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x184,"Expected: tx.GetTxOut(1) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffff00000000;
  uVar2 = cfd::core::Transaction::GetTxOutIndex((Script *)&tx);
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&txout_ref,"0","tx.GetTxOutIndex(script)",(int *)&gtest_ar_7,
             (uint *)&index_list);
  if (txout_ref == (TxOutReference)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index_list,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x185,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index_list,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_list);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1c0);
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOutIndexList((Script *)&txout_ref);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&index_list,&txout_ref);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&txout_ref);
    }
  }
  else {
    testing::Message::Message((Message *)&txout_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x187,
               "Expected: (index_list = tx.GetTxOutIndexList(script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  local_1d8.data_._0_4_ = 2;
  gtest_ar_7._0_8_ =
       (long)index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&txout_ref,"2","index_list.size()",(int *)&local_1d8,
             (unsigned_long *)&gtest_ar_7);
  if (txout_ref == (TxOutReference)0x0) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x188,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1c0);
  if ((long)index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&txout_ref,"0","index_list[0]",(int *)&gtest_ar_7,
               index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (txout_ref == (TxOutReference)0x0) {
      testing::Message::Message((Message *)&gtest_ar_7);
      if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1c0);
    gtest_ar_7._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&txout_ref,"1","index_list[1]",(int *)&gtest_ar_7,
               index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1);
    if (txout_ref == (TxOutReference)0x0) {
      testing::Message::Message((Message *)&gtest_ar_7);
      if ((undefined8 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT71(local_1c0._1_7_,local_1c0[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1c0);
  }
  local_1d8.data_ = (AssertHelperData *)cfd::core::Amount::CreateBySatoshiAmount(0x74cbb1);
  local_1d0 = extraout_DL_01;
  cfd::core::TxOutReference::TxOutReference(&txout_ref);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetTxOutValue((uint)&tx,(Amount *)0x1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x191,
               "Expected: tx.SetTxOutValue(1, amt2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_260,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)&gtest_ar_7);
      cfd::core::AbstractTxOutReference::operator=
                ((AbstractTxOutReference *)&txout_ref,(AbstractTxOutReference *)&gtest_ar_7);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference
                ((AbstractTxOutReference *)&gtest_ar_7);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x192,
               "Expected: (txout_ref = tx.GetTxOut(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_260,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  local_260[0].data_ = (AssertHelperData *)CONCAT71(local_1c0._1_7_,local_1c0[0]);
  local_260[1].data_._0_1_ = local_1c0[8];
  local_250.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_100 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_7,"txout_ref.GetValue().GetSatoshiValue()",
             "amt2.GetSatoshiValue()",(long *)&local_250,&local_100);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)local_260);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_260);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((uint)&tx);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x196,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_260,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((uint)&tx);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x197,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_260,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  local_260[0].data_._0_4_ = uVar2;
  local_250.data_ = local_250.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar_7,"tx.GetTxOutCount()","0",(uint *)local_260,(int *)&local_250);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)local_260);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x198,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_260);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::GetTxOut((uint)&local_f8);
    cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&local_f8);
  }
  testing::Message::Message((Message *)&gtest_ar_7);
  testing::internal::AssertHelper::AssertHelper
            (local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x199,
             "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_260,(Message *)&gtest_ar_7);
  testing::internal::AssertHelper::~AssertHelper(local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_7);
  cfd::core::AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&txout_ref);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::Script::~Script(&script);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(Transaction, AddTxOut_RemoveTxOut) {
  Transaction tx(exp_version, exp_locktime);
  Script script("76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac");

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(tx.GetTxOut(0));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW(tx.GetTxOut(1));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW((index_list = tx.GetTxOutIndexList(script)));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(1, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  TxOutReference txout_ref;
  EXPECT_NO_THROW(tx.SetTxOutValue(1, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(1)));
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(),
            amt2.GetSatoshiValue());

  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  EXPECT_THROW(tx.GetTxOut(0), CfdException);
}